

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O3

void __thiscall
cfd::core::Serializer::AddPrefixBuffer(Serializer *this,uint64_t prefix,ByteData *buffer)

{
  CfdException *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  uint8_t *local_58;
  long local_50;
  long local_48;
  undefined1 local_40 [32];
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,&buffer->data_);
  if ((ulong)(local_50 - (long)local_58) >> 0x20 == 0) {
    AddPrefixBuffer(this,prefix,local_58,(uint32_t)(local_50 - (long)local_58));
    if (local_58 != (uint8_t *)0x0) {
      operator_delete(local_58,local_48 - (long)local_58);
    }
    return;
  }
  local_40._0_8_ = "cfdcore_bytedata.cpp";
  local_40._8_4_ = 0x19d;
  local_40._16_8_ = "AddPrefixBuffer";
  logger::log<>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"It exceeds the handling size.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"It exceeds the handling size.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Serializer::AddPrefixBuffer(uint64_t prefix, const ByteData& buffer) {
  auto buf = buffer.GetBytes();
  if (buf.size() > std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "It exceeds the handling size.");
    throw CfdException(kCfdIllegalStateError, "It exceeds the handling size.");
  }
  AddPrefixBuffer(prefix, buf.data(), static_cast<uint32_t>(buf.size()));
}